

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_compensation.cpp
# Opt level: O3

void mc::subtract_block(TRIPLEYCbCr **base,TRIPLEYCbCr **target,TRIPLEYCbCr **out,block_info block,
                       vect v)

{
  long lVar1;
  size_t sVar2;
  uint8_t uVar3;
  long lVar4;
  size_t sVar5;
  
  if (block.height != 0) {
    lVar4 = block.super_pos.x * 3 + 2;
    sVar5 = 0;
    lVar1 = lVar4;
    sVar2 = block.width;
    do {
      for (; sVar2 != 0; sVar2 = sVar2 - 1) {
        uVar3 = clip(((uint)(&target[block.super_pos.y + sVar5]->Cr)[lVar1] -
                     (uint)(&base[block.super_pos.y + ((long)v >> 0x20) + sVar5][v.x].Cr)[lVar1]) +
                     0x80,'\0',0xff);
        (&out[block.super_pos.y + sVar5]->Cr)[lVar1] = uVar3;
        lVar1 = lVar1 + 3;
      }
      sVar5 = sVar5 + 1;
      lVar1 = lVar4;
      sVar2 = block.width;
    } while (sVar5 != block.height);
  }
  return;
}

Assistant:

void mc::subtract_block(TRIPLEYCbCr **base, TRIPLEYCbCr **target, TRIPLEYCbCr **out, mc::block_info block, mc::vect v) {
    for (int i = 0; i < block.height; i++) {
        for (int j = 0; j < block.width; j++) {
            out[block.y + i][block.x + j].Y = clip(
                    128 + target[block.y + i][block.x + j].Y - base[block.y + v.y + i][block.x + v.x + j].Y,
                    0,
                    255);
        }
    }
}